

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O3

bool Assimp::IFC::ProcessCurve(IfcCurve *curve,TempMesh *meshout,ConversionData *conv)

{
  pointer *ppuVar1;
  iterator __position;
  Curve *pCVar2;
  BoundedCurve *this;
  long *plVar3;
  size_type *psVar4;
  bool bVar5;
  allocator local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 local_198 [376];
  
  pCVar2 = Curve::Convert(curve,conv);
  if (pCVar2 == (Curve *)0x0) {
    std::__cxx11::string::string
              ((string *)local_1b8,
               *(char **)(&(curve->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem
                           .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           field_0x10 +
                         (long)(curve->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper[-3]),&local_1d9);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1b8,0,(char *)0x0,0x7853e0);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_1d8.field_2._M_allocated_capacity = *psVar4;
      local_1d8.field_2._8_8_ = plVar3[3];
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar4;
      local_1d8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_1d8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_198,
               &local_1d8);
    LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_198);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0]);
    }
    bVar5 = false;
  }
  else {
    this = (BoundedCurve *)__dynamic_cast(pCVar2,&Curve::typeinfo,&BoundedCurve::typeinfo,0);
    if (this == (BoundedCurve *)0x0) {
      LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5a67a7);
      bVar5 = false;
    }
    else {
      BoundedCurve::SampleDiscrete(this,meshout);
      local_198._0_4_ =
           (int)((ulong)((long)(meshout->mVerts).
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(meshout->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      __position._M_current =
           (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&meshout->mVertcnt,__position,(uint *)local_198);
      }
      else {
        *__position._M_current = local_198._0_4_;
        ppuVar1 = &(meshout->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      bVar5 = true;
    }
    (*pCVar2->_vptr_Curve[1])(pCVar2);
  }
  return bVar5;
}

Assistant:

bool ProcessCurve(const Schema_2x3::IfcCurve& curve,  TempMesh& meshout, ConversionData& conv)
{
    std::unique_ptr<const Curve> cv(Curve::Convert(curve,conv));
    if (!cv) {
        IFCImporter::LogWarn("skipping unknown IfcCurve entity, type is " + curve.GetClassName());
        return false;
    }

    // we must have a bounded curve at this point
    if (const BoundedCurve* bc = dynamic_cast<const BoundedCurve*>(cv.get())) {
        try {
            bc->SampleDiscrete(meshout);
        }
        catch(const  CurveError& cv) {
            IFCImporter::LogError(cv.mStr + " (error occurred while processing curve)");
            return false;
        }
        meshout.mVertcnt.push_back(static_cast<unsigned int>(meshout.mVerts.size()));
        return true;
    }

    IFCImporter::LogError("cannot use unbounded curve as profile");
    return false;
}